

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::MaybeHaveInterfaceProperty
          (cmGeneratorTarget *this,string *prop,cmGeneratorExpressionContext *context,
          LinkInterfaceFor interfaceFor)

{
  uchar uVar1;
  pointer pcVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  _Var3;
  cmValue cVar4;
  cmLinkInterfaceLibraries *pcVar5;
  cmGeneratorTarget *head;
  cmLinkItem *lib;
  pointer pcVar6;
  bool bVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>,_bool>
  pVar8;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,prop,'@');
  std::operator+(&key,&local_50,&context->Config);
  std::__cxx11::string::~string((string *)&local_50);
  _Var3._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->MaybeInterfacePropertyExists)._M_h,&key);
  if (_Var3._M_cur == (__node_type *)0x0) {
    local_50._M_dataplus._M_p._0_1_ = 0;
    pVar8 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string_const&,bool>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->MaybeInterfacePropertyExists,&key);
    _Var3._M_cur = (__node_type *)
                   pVar8.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
                   ._M_cur;
    cVar4 = GetProperty(this,prop);
    if (cVar4.Value == (string *)0x0) {
      *(undefined1 *)((long)_Var3._M_cur + 0x28) = 0;
    }
    else {
      bVar7 = (cVar4.Value)->_M_string_length != 0;
      *(bool *)((long)_Var3._M_cur + 0x28) = bVar7;
      if (bVar7) goto LAB_003e497c;
    }
    head = context->HeadTarget;
    if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
      head = this;
    }
    pcVar5 = GetLinkInterfaceLibraries(this,&context->Config,head,interfaceFor);
    if (pcVar5 != (cmLinkInterfaceLibraries *)0x0) {
      if (pcVar5->HadHeadSensitiveCondition == false) {
        pcVar2 = (pcVar5->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pcVar6 = (pcVar5->Libraries).
                      super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                      super__Vector_impl_data._M_start; pcVar6 != pcVar2; pcVar6 = pcVar6 + 1) {
          if ((pcVar6->Target != (cmGeneratorTarget *)0x0) &&
             (bVar7 = MaybeHaveInterfaceProperty(pcVar6->Target,prop,context,interfaceFor), bVar7))
          goto LAB_003e4a07;
        }
      }
      else {
LAB_003e4a07:
        *(undefined1 *)((long)_Var3._M_cur + 0x28) = 1;
      }
    }
  }
LAB_003e497c:
  uVar1 = ((_Var3._M_cur)->
          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
          ).
          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
          ._M_storage._M_storage.__data[0x20];
  std::__cxx11::string::~string((string *)&key);
  return (bool)uVar1;
}

Assistant:

bool cmGeneratorTarget::MaybeHaveInterfaceProperty(
  std::string const& prop, cmGeneratorExpressionContext* context,
  LinkInterfaceFor interfaceFor) const
{
  std::string const key = prop + '@' + context->Config;
  auto i = this->MaybeInterfacePropertyExists.find(key);
  if (i == this->MaybeInterfacePropertyExists.end()) {
    // Insert an entry now in case there is a cycle.
    i = this->MaybeInterfacePropertyExists.emplace(key, false).first;
    bool& maybeInterfaceProp = i->second;

    // If this target itself has a non-empty property value, we are done.
    maybeInterfaceProp = cmNonempty(this->GetProperty(prop));

    // Otherwise, recurse to interface dependencies.
    if (!maybeInterfaceProp) {
      cmGeneratorTarget const* headTarget =
        context->HeadTarget ? context->HeadTarget : this;
      if (cmLinkInterfaceLibraries const* iface =
            this->GetLinkInterfaceLibraries(context->Config, headTarget,
                                            interfaceFor)) {
        if (iface->HadHeadSensitiveCondition) {
          // With a different head target we may get to a library with
          // this interface property.
          maybeInterfaceProp = true;
        } else {
          // The transitive interface libraries do not depend on the
          // head target, so we can follow them.
          for (cmLinkItem const& lib : iface->Libraries) {
            if (lib.Target &&
                lib.Target->MaybeHaveInterfaceProperty(prop, context,
                                                       interfaceFor)) {
              maybeInterfaceProp = true;
              break;
            }
          }
        }
      }
    }
  }
  return i->second;
}